

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bitops.cpp
# Opt level: O1

int main(void)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ostream *poVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  
  iVar8 = 0;
  do {
    uVar2 = rand();
    iVar3 = rand();
    uVar7 = (ulong)uVar2 << 0x20 | (long)iVar3;
    if (uVar7 == 0) {
      __assert_fail("x != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/bitops.hpp"
                    ,0x33,"unsigned int trailing_zeros(uint64_t)");
    }
    iVar6 = 0;
    iVar9 = 0;
    if (((long)iVar3 & 1U) == 0) {
      iVar9 = 0;
      uVar4 = uVar7;
      do {
        iVar9 = iVar9 + 1;
        uVar1 = uVar4 & 2;
        uVar4 = uVar4 >> 1;
      } while (uVar1 == 0);
    }
    if (-1 < (long)uVar7) {
      iVar6 = 0;
      uVar4 = uVar7;
      do {
        iVar6 = iVar6 + 1;
        uVar4 = uVar4 * 2;
      } while (-1 < (long)uVar4);
    }
    uVar4 = uVar7 >> 1 | uVar7;
    uVar4 = uVar4 >> 2 | uVar4;
    uVar4 = uVar4 >> 4 | uVar4;
    uVar4 = uVar4 >> 8 | uVar4;
    uVar4 = uVar4 >> 0x10 | uVar4;
    uVar4 = uVar4 >> 0x20 | uVar4;
    iVar3 = *(int *)(log2_64(unsigned_long)::tab64 +
                    ((uVar4 - (uVar4 >> 1)) * 0x7edd5e59a4e28c2 >> 0x3a) * 4);
    if (*(int *)(trailing_zeros(unsigned_long)::index64 +
                ((-uVar7 & uVar7) * 0x3f79d71b4cb0a89 >> 0x3a) * 4) != iVar9) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error! trailing zeros: ",0x17);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," != ",4);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    if (0x3f - iVar3 != iVar6) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error! leading zeros: ",0x16);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," != ",4);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    iVar8 = iVar8 + 1;
  } while (iVar8 != 100000000);
  return 0;
}

Assistant:

int main()
{
    // run a large set of random tests
    unsigned int sum = 0;
    int num_tests = 100000000;
    for (int i = 0; i < num_tests; ++i)
    {
        uint64_t x = 0;
        x |= static_cast<uint64_t>(rand()) << 32;
        x |= static_cast<uint64_t>(rand());

        unsigned int t1 = trailing_zeros(x);
        unsigned int t2 = reference_trailing_zeros(x);
        //unsigned int t2 = t1;
        //sum += t2;

        unsigned int l1 = leading_zeros(x);
        unsigned int l2 = reference_leading_zeros(x);
        //unsigned int l2 = l1;
        //sum += l2;

        if (t1 != t2) {
            std::cerr << "Error! trailing zeros: " << t1 << " != " << t2 << std::endl;
        }
        if (l1 != l2) {
            std::cerr << "Error! leading zeros: " << l1 << " != " << l2 << std::endl;
        }
    }
    return sum;
}